

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op2d.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
backtrack(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
         vector<unsigned_int,_std::allocator<unsigned_int>_> *cp_raw)

{
  uint uVar1;
  iterator __position;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  pointer puVar5;
  uint x;
  uint local_1c;
  
  puVar3 = (cp_raw->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1c = (cp_raw->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1];
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1c != 0) {
    do {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,&local_1c);
        puVar3 = (cp_raw->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = local_1c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1c = puVar3[local_1c];
    } while (local_1c != 0);
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = puVar2 + -1;
    if (puVar3 < puVar5 && puVar3 != puVar2) {
      do {
        puVar4 = puVar3 + 1;
        uVar1 = *puVar3;
        *puVar3 = *puVar5;
        *puVar5 = uVar1;
        puVar5 = puVar5 + -1;
        puVar3 = puVar4;
      } while (puVar4 < puVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> backtrack(vector<unsigned int> cp_raw) {
  /* @brief  backtrack the changepoint vector */
  unsigned int x = cp_raw[cp_raw.size() - 1];
  vector<unsigned int> cp;
  while (x > 0) {
    cp.push_back(x);
    x = cp_raw[x];
  }
  reverse(cp.begin(), cp.end());
  return cp;
}